

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O1

int dowhatisinv(obj *obj)

{
  uchar uVar1;
  ushort uVar2;
  char *pcVar3;
  objclass *poVar4;
  long lVar5;
  char *inp;
  boolean without_asking;
  ulong uVar6;
  byte bVar7;
  byte *pbVar8;
  
  if (obj == (obj *)0x0) {
    obj = getobj("\x14","examine",(obj **)0x0);
  }
  poVar4 = objects;
  if (obj == &zeroobj || obj == (obj *)0x0) {
    return 0;
  }
  uVar1 = obj->onamelth;
  if ((uVar1 != '\0') && ((obj->field_0x4a & 0x30) != 0)) {
    lVar5 = (long)obj->oxlth;
    bVar7 = *(byte *)((long)obj->oextra + lVar5);
    without_asking = (byte)(bVar7 + 0xbf) < 0x1a || bVar7 == 0;
    if ((byte)(bVar7 + 0xbf) < 0x1a) {
      pbVar8 = (byte *)((long)obj->oextra + lVar5 + 1);
      do {
        if ((0x19 < (byte)((bVar7 & 0xdf) + 0xbf)) &&
           ((0x2d < bVar7 || ((0x208100000000U >> ((ulong)bVar7 & 0x3f) & 1) == 0)))) {
          without_asking = false;
        }
        bVar7 = *pbVar8;
      } while ((bVar7 != 0) && (pbVar8 = pbVar8 + 1, (bool)without_asking != false));
    }
    if ((bool)without_asking != false) {
      inp = (char *)((long)obj->oextra + lVar5);
      goto LAB_0020d652;
    }
  }
  uVar2 = obj->otyp;
  uVar6 = (ulong)uVar2;
  if (uVar2 < 0x10f) {
    if ((uVar2 != 0xf6) && (uVar2 != 0x10e)) goto LAB_0020d61e;
  }
  else if (uVar2 == 0x10f) {
    uVar6 = (ulong)obj->corpsenm;
    if ((long)uVar6 < 0) goto LAB_0020d61e;
    if ((obj->field_0x4a & 0x10) == 0) {
      bVar7 = mvitals[uVar6].mvflags & 8;
      uVar6 = uVar6 * 3;
      goto joined_r0x0020d5f1;
    }
  }
  else if (uVar2 != 0x215) {
    if (((uVar2 == 0x129) && (obj->spe < '\x01')) && (-1 < obj->corpsenm)) {
      bVar7 = obj->field_0x4a & 0x10;
joined_r0x0020d5f1:
      if (bVar7 != 0) goto LAB_0020d605;
    }
LAB_0020d61e:
    without_asking = -0x28;
    pcVar3 = objects[(short)uVar2].oc_uname;
    obj->onamelth = '\0';
    poVar4[(short)uVar2].oc_uname = (char *)0x0;
    inp = xname_single(obj);
    obj->onamelth = uVar1;
    poVar4[(short)uVar2].oc_uname = pcVar3;
    goto LAB_0020d652;
  }
LAB_0020d605:
  without_asking = (boolean)uVar6;
  inp = mons_mname(mons + obj->corpsenm);
LAB_0020d652:
  checkfile(inp,(permonst *)0x1,'\x01',without_asking);
  return 0;
}

Assistant:

int dowhatisinv(struct obj *obj)
{
	static const char allowall[] = { ALL_CLASSES, 0 };

	if (!obj)
	    obj = getobj(allowall, "examine", NULL);
	if (!obj || obj == &zeroobj)
	    return 0;

	/* Fake user_typed_name for feedback on failure to find an entry. */
	checkfile(database_oname(obj), NULL, TRUE, TRUE);

	return 0;
}